

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall wasm::TranslateToFuzzReader::makeStringConcat(TranslateToFuzzReader *this)

{
  Expression *pEVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  
  pEVar1 = makeTrappingRefUse(this,(HeapType)0x50);
  pEVar2 = makeTrappingRefUse(this,(HeapType)0x50);
  pEVar3 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
  pEVar3->_id = StringConcatId;
  (pEVar3->type).id = 0;
  *(Expression **)(pEVar3 + 1) = pEVar1;
  pEVar3[1].type.id = (uintptr_t)pEVar2;
  wasm::StringConcat::finalize();
  return pEVar3;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringConcat() {
  auto* left = makeTrappingRefUse(HeapType::string);
  auto* right = makeTrappingRefUse(HeapType::string);
  return builder.makeStringConcat(left, right);
}